

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertion_tests.cpp
# Opt level: O2

void __thiscall iu_AssertionTest_x_iutest_x_GT_Test::Body(iu_AssertionTest_x_iutest_x_GT_Test *this)

{
  double *in_R9;
  int x1;
  int x0;
  AssertionResult iutest_ar;
  double d1;
  double d0;
  float f1;
  float f0;
  char local_208 [4];
  int local_204;
  AssertionResult local_200;
  iuCodeMessage local_1d8;
  char local_1a8 [8];
  double local_1a0;
  char local_198 [4];
  float local_194;
  Fixed local_190;
  
  local_204 = 0;
  local_194 = 0.0;
  local_208[0] = '\x01';
  local_208[1] = '\0';
  local_208[2] = '\0';
  local_208[3] = '\0';
  local_1a0 = 0.0;
  local_198[0] = '\0';
  local_198[1] = '\0';
  local_198[2] = -0x80;
  local_198[3] = '?';
  local_1a8[0] = '\0';
  local_1a8[1] = '\0';
  local_1a8[2] = '\0';
  local_1a8[3] = '\0';
  local_1a8[4] = '\0';
  local_1a8[5] = '\0';
  local_1a8[6] = -0x10;
  local_1a8[7] = '?';
  iutest::internal::CmpHelperGT<float,float>
            (&local_200,(internal *)0x30ca7c,"f0",local_198,&local_194,(float *)in_R9);
  if (local_200.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
               ,0xa9,local_200.m_message._M_dataplus._M_p);
    local_1d8._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1d8,&local_190);
    std::__cxx11::string::~string((string *)&local_1d8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&local_200);
  iutest::internal::CmpHelperGT<int,int>
            (&local_200,(internal *)0x30c9ef,"x0",local_208,&local_204,(int *)in_R9);
  if (local_200.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
               ,0xaa,local_200.m_message._M_dataplus._M_p);
    local_1d8._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1d8,&local_190);
  }
  else {
    std::__cxx11::string::~string((string *)&local_200);
    local_190.super_Message.m_stream.super_iu_stringstream._0_4_ = 1;
    local_1d8.m_message._M_dataplus._M_p._0_4_ = 0;
    iutest::internal::CmpHelperGT<int,float>
              (&local_200,(internal *)"0x1","0.0f",(char *)&local_190,(int *)&local_1d8,
               (float *)in_R9);
    if (local_200.m_result == false) {
      memset(&local_190,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
                 ,0xab,local_200.m_message._M_dataplus._M_p);
      local_1d8._44_4_ = 0xffffffff;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1d8,&local_190);
      std::__cxx11::string::~string((string *)&local_1d8);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
    }
    std::__cxx11::string::~string((string *)&local_200);
    iutest::internal::CmpHelperGT<double,double>
              (&local_200,(internal *)0x30caa6,"d0",local_1a8,&local_1a0,in_R9);
    if (local_200.m_result != false) goto LAB_0025a346;
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
               ,0xac,local_200.m_message._M_dataplus._M_p);
    local_1d8._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1d8,&local_190);
  }
  std::__cxx11::string::~string((string *)&local_1d8);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_190);
LAB_0025a346:
  std::__cxx11::string::~string((string *)&local_200);
  return;
}

Assistant:

IUTEST(AssertionTest, GT)
{
    int x0=0, x1=1;
    float f0=0.0f, f1=1.0f;
    double d0=0.0, d1=1.0;
    IUTEST_EXPECT_GT(f1, f0);
    IUTEST_ASSERT_GT(x1, x0);
    IUTEST_INFORM_GT(0x1, 0.0f);
    IUTEST_EXPECT_GT(d1, d0);
}